

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O1

bool HasAddressTaken(VariableData *container)

{
  uint uVar1;
  uint uVar2;
  VmValueType VVar3;
  VmConstant **ppVVar4;
  VmConstant *pVVar5;
  VmValue *pVVar6;
  VmConstant *pVVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  if (container->isVmRegSpill == false) {
    uVar9 = (ulong)(container->users).count;
    bVar12 = uVar9 != 0;
    if (bVar12) {
      ppVVar4 = (container->users).data;
      uVar11 = 0;
      do {
        pVVar5 = ppVVar4[uVar11];
        bVar13 = (pVVar5->super_VmValue).hasKnownNonSimpleUse;
        if ((pVVar5->super_VmValue).hasKnownSimpleUse == true) {
          bVar8 = false;
          if (bVar13 != false) {
            __assert_fail("!user->hasKnownNonSimpleUse",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                          ,0x128,"bool HasAddressTaken(VariableData *)");
          }
        }
        else {
          bVar8 = true;
          if (bVar13 == false) {
            uVar1 = (pVVar5->super_VmValue).users.count;
            bVar13 = uVar1 != 0;
            if (bVar13) {
              lVar10 = 0;
              do {
                pVVar6 = (pVVar5->super_VmValue).users.data[lVar10];
                if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                                ,0x160,"bool HasAddressTaken(VariableData *)");
                }
                uVar2 = *(uint *)&pVVar6[1]._vptr_VmValue;
                if (6 < uVar2) {
                  if (uVar2 - 8 < 7) {
                    if (pVVar6[1].type.type == VM_TYPE_VOID) goto LAB_001af0bd;
                    if ((VmConstant *)**(long **)&pVVar6[1].typeID == pVVar5) goto LAB_001af055;
                  }
                  if (uVar2 == 0x1a) {
                    if (pVVar6[1].type.type == VM_TYPE_VOID) goto LAB_001af0bd;
                    pVVar7 = (VmConstant *)**(long **)&pVVar6[1].typeID;
joined_r0x001af01e:
                    if (pVVar7 == pVVar5) goto LAB_001af055;
                  }
                  else if (uVar2 == 0x1b) {
                    VVar3 = pVVar6[1].type.type;
                    if (VVar3 == VM_TYPE_VOID) goto LAB_001af0bd;
                    if ((VmConstant *)**(long **)&pVVar6[1].typeID == pVVar5) goto LAB_001af055;
                    if (VVar3 < VM_TYPE_LONG) goto LAB_001af0bd;
                    pVVar7 = (VmConstant *)(*(long **)&pVVar6[1].typeID)[2];
                    goto joined_r0x001af01e;
                  }
                  if (uVar2 - 0x1f < 2) {
                    if (pVVar5->isReference != false) goto LAB_001af055;
                  }
                  else if (uVar2 - 0x33 < 0x11) {
                    if (pVVar6[1].type.type < VM_TYPE_DOUBLE) {
LAB_001af0bd:
                      __assert_fail("index < count",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                    ,0x199,
                                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                   );
                    }
                    if (*(VmConstant **)(*(long *)&pVVar6[1].typeID + 8) == pVVar5)
                    goto LAB_001af055;
                  }
                  (pVVar5->super_VmValue).hasKnownNonSimpleUse = true;
                  break;
                }
LAB_001af055:
                lVar10 = lVar10 + 1;
                bVar13 = (uint)lVar10 < uVar1;
              } while ((uint)lVar10 != uVar1);
            }
            bVar8 = true;
            if (!bVar13) {
              (pVVar5->super_VmValue).hasKnownSimpleUse = true;
              bVar8 = false;
            }
          }
        }
        if (bVar8) {
          return bVar12;
        }
        uVar11 = uVar11 + 1;
        bVar12 = uVar11 < uVar9;
      } while (uVar11 != uVar9);
    }
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool HasAddressTaken(VariableData *container)
{
	if(container->isVmRegSpill)
		return false;

	for(unsigned userPos = 0, userCount = container->users.count; userPos < userCount; userPos++)
	{
		VmConstant *user = container->users.data[userPos];

		if(user->hasKnownSimpleUse)
		{
			assert(!user->hasKnownNonSimpleUse);
			continue;
		}

		if(user->hasKnownNonSimpleUse)
			return true;

		for(unsigned i = 0, e = user->users.count; i < e; i++)
		{
			VmValue *value = user->users.data[i];

			if(VmInstruction *inst = value->typeID == VmInstruction::myTypeID ? static_cast<VmInstruction*>(value) : NULL)
			{
				bool simpleUse = false;

				if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
				{
					simpleUse = true;
				}
				else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
				{
					if(user->isReference)
						simpleUse = true;
					else
						simpleUse = false;
				}
				else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
				{
					simpleUse = true;
				}
				else
				{
					simpleUse = false;
				}

				if(!simpleUse)
				{
					user->hasKnownNonSimpleUse = true;

					return true;
				}
			}
			else
			{
				assert(!"invalid constant use");
			}
		}

		user->hasKnownSimpleUse = true;
	}

	return false;
}